

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_openbyindex(zip_t *zip,size_t index)

{
  ushort uVar1;
  uint uVar2;
  mz_zip_internal_state *pmVar3;
  void *pvVar4;
  int iVar5;
  mz_bool mVar6;
  char *pcVar7;
  mz_zip_archive_file_stat stats;
  mz_zip_archive_file_stat mStack_478;
  
  if (zip != (zip_t *)0x0) {
    iVar5 = -4;
    if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) &&
       (iVar5 = -10, index < (zip->archive).m_total_files)) {
      pmVar3 = (zip->archive).m_pState;
      pvVar4 = (pmVar3->m_central_dir).m_p;
      if (pvVar4 == (void *)0x0) {
        iVar5 = -0xb;
      }
      else {
        uVar2 = *(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + index * 4);
        uVar1 = *(ushort *)((long)pvVar4 + (ulong)uVar2 + 0x1c);
        pcVar7 = (zip->entry).name;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
          (zip->entry).name = (char *)0x0;
        }
        pcVar7 = zip_strclone((char *)((long)pvVar4 + (ulong)uVar2 + 0x2e),(ulong)uVar1);
        (zip->entry).name = pcVar7;
        if (pcVar7 == (char *)0x0) {
          iVar5 = -2;
        }
        else {
          mVar6 = mz_zip_reader_file_stat(&zip->archive,(mz_uint)index,&mStack_478);
          if (mVar6 == 0) {
            iVar5 = -3;
          }
          else {
            (zip->entry).index = index;
            (zip->entry).comp_size = mStack_478.m_comp_size;
            (zip->entry).uncomp_size = mStack_478.m_uncomp_size;
            (zip->entry).uncomp_crc32 = mStack_478.m_crc32;
            (zip->entry).dir_offset = mStack_478.m_central_dir_ofs;
            (zip->entry).header_offset = mStack_478.m_local_header_ofs;
            (zip->entry).method = mStack_478.m_method;
            (zip->entry).external_attr = mStack_478.m_external_attr;
            (zip->entry).m_time = mStack_478.m_time;
            iVar5 = 0;
          }
        }
      }
    }
    return iVar5;
  }
  return -1;
}

Assistant:

int zip_entry_openbyindex(struct zip_t *zip, size_t index) {
  mz_zip_archive *pZip = NULL;
  mz_zip_archive_file_stat stats;
  mz_uint namelen;
  const mz_uint8 *pHeader;
  const char *pFilename;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  pZip = &(zip->archive);
  if (pZip->m_zip_mode != MZ_ZIP_MODE_READING) {
    // open by index requires readonly mode
    return ZIP_EINVMODE;
  }

  if (index >= (size_t)pZip->m_total_files) {
    // index out of range
    return ZIP_EINVIDX;
  }

  if (!(pHeader = &MZ_ZIP_ARRAY_ELEMENT(
            &pZip->m_pState->m_central_dir, mz_uint8,
            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                 mz_uint32, index)))) {
    // cannot find header in central directory
    return ZIP_ENOHDR;
  }

  namelen = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;

  if (zip->entry.name) {
    CLEANUP(zip->entry.name);
  }

  zip->entry.name = zip_strclone(pFilename, namelen);
  if (!zip->entry.name) {
    // local entry name is NULL
    return ZIP_EINVENTNAME;
  }

  if (!mz_zip_reader_file_stat(pZip, (mz_uint)index, &stats)) {
    return ZIP_ENOENT;
  }

  zip->entry.index = (ssize_t)index;
  zip->entry.comp_size = stats.m_comp_size;
  zip->entry.uncomp_size = stats.m_uncomp_size;
  zip->entry.uncomp_crc32 = stats.m_crc32;
  zip->entry.dir_offset = stats.m_central_dir_ofs;
  zip->entry.header_offset = stats.m_local_header_ofs;
  zip->entry.method = stats.m_method;
  zip->entry.external_attr = stats.m_external_attr;
#ifndef MINIZ_NO_TIME
  zip->entry.m_time = stats.m_time;
#endif

  return 0;
}